

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void * mi_expand(void *p,size_t newsize)

{
  size_t sVar1;
  void *pvVar2;
  
  if (p != (void *)0x0) {
    sVar1 = _mi_usable_size(p,(char *)newsize);
    pvVar2 = (void *)0x0;
    if (newsize <= sVar1) {
      pvVar2 = p;
    }
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

void* mi_expand(void* p, size_t newsize) mi_attr_noexcept {
  #if MI_PADDING
  // we do not shrink/expand with padding enabled
  MI_UNUSED(p); MI_UNUSED(newsize);
  return NULL;
  #else
  if (p == NULL) return NULL;
  const size_t size = _mi_usable_size(p,"mi_expand");
  if (newsize > size) return NULL;
  return p; // it fits
  #endif
}